

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O2

vector<unsigned_int,_std::allocator<unsigned_int>_> *
mxx::gather<unsigned_int>
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,uint *data,
          size_t size,int root,comm *comm)

{
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (__return_storage_ptr__,(long)comm->m_size * size);
  gather<unsigned_int>
            (data,size,
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,root,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gather(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    if (comm.rank() == root)
        result.resize(size*comm.size());
    gather(data, size, &result[0], root, comm);
    return result;
}